

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

UHashElement * uhash_nextElement_63(UHashtable *hash,int32_t *pos)

{
  UHashElement *pUVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = (ulong)*pos;
  lVar2 = uVar4 * 0x18;
  uVar6 = uVar4;
  do {
    lVar5 = lVar2;
    uVar6 = uVar6 + 1;
    if ((long)hash->length <= (long)uVar6) {
      return (UHashElement *)0x0;
    }
    pUVar1 = hash->elements;
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
    lVar2 = lVar5 + 0x18;
  } while (*(int *)((long)&pUVar1[1].hashcode + lVar5) < 0);
  *pos = uVar3;
  return (UHashElement *)((long)&pUVar1[1].hashcode + lVar5);
}

Assistant:

U_CAPI const UHashElement* U_EXPORT2
uhash_nextElement(const UHashtable *hash, int32_t *pos) {
    /* Walk through the array until we find an element that is not
     * EMPTY and not DELETED.
     */
    int32_t i;
    U_ASSERT(hash != NULL);
    for (i = *pos + 1; i < hash->length; ++i) {
        if (!IS_EMPTY_OR_DELETED(hash->elements[i].hashcode)) {
            *pos = i;
            return &(hash->elements[i]);
        }
    }

    /* No more elements */
    return NULL;
}